

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O0

void __thiscall HeavyLight_Queries_Test::HeavyLight_Queries_Test(HeavyLight_Queries_Test *this)

{
  HeavyLight_Queries_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HeavyLight_Queries_Test_001a30f8;
  return;
}

Assistant:

TEST(HeavyLight, Queries) {
    srand(1);
    int n = 10;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        rep(a, 0, n) rep(b, a, n) {
            query(a, b);
        }
        break;
    }
}